

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O2

void anon_unknown.dwarf_2cd883::wavEncodeDecode
               (Array2D<unsigned_short> *a,Array2D<unsigned_short> *b,int nx,int ny)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  ulong uVar3;
  unsigned_short *puVar4;
  ushort uVar5;
  ulong uVar6;
  ushort *puVar7;
  unsigned_short *puVar8;
  int x;
  ulong uVar9;
  ulong uVar10;
  
  uVar3 = 0;
  uVar6 = 0;
  if (0 < nx) {
    uVar6 = (ulong)(uint)nx;
  }
  uVar10 = 0;
  if (0 < ny) {
    uVar10 = (ulong)(uint)ny;
  }
  uVar5 = 0;
  puVar7 = a->_data;
  for (; uVar3 != uVar10; uVar3 = uVar3 + 1) {
    for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      if (uVar5 <= puVar7[uVar9]) {
        uVar5 = puVar7[uVar9];
      }
    }
    puVar7 = puVar7 + a->_sizeY;
  }
  Imf_3_4::wav2Encode(a->_data,nx,1,ny,nx,uVar5);
  Imf_3_4::wav2Decode(a->_data,nx,1,ny,nx,uVar5);
  puVar4 = a->_data;
  puVar8 = b->_data;
  uVar3 = 0;
  do {
    if (uVar3 == uVar10) {
      return;
    }
    uVar9 = 0;
    while (uVar6 != uVar9) {
      puVar1 = puVar4 + uVar9;
      puVar2 = puVar8 + uVar9;
      uVar9 = uVar9 + 1;
      if (*puVar1 != *puVar2) {
        __assert_fail("a[y][x] == b[y][x]",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testWav.cpp"
                      ,0x9b,
                      "void (anonymous namespace)::wavEncodeDecode(Array2D<unsigned short> &, const Array2D<unsigned short> &, int, int)"
                     );
      }
    }
    uVar3 = uVar3 + 1;
    puVar8 = puVar8 + b->_sizeY;
    puVar4 = puVar4 + a->_sizeY;
  } while( true );
}

Assistant:

void
wavEncodeDecode (
    Array2D<unsigned short>&       a,
    const Array2D<unsigned short>& b,
    int                            nx,
    int                            ny)
{
    unsigned short mx = maxValue (a, nx, ny);

    //cout << "encoding " << flush;

    wav2Encode (&a[0][0], nx, 1, ny, nx, mx);

    //cout << "decoding " << flush;

    wav2Decode (&a[0][0], nx, 1, ny, nx, mx);

    //cout << "comparing" << endl;

    for (int y = 0; y < ny; ++y)
    {
        for (int x = 0; x < nx; ++x)
        {
            //cout << x << ' ' << y << ' ' << a[y][x] << ' ' << b[y][x] << endl;
            assert (a[y][x] == b[y][x]);
        }
    }
}